

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicationFolder.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
license::locate::ApplicationFolder::license_locations_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,ApplicationFolder *this,EventRegistry *eventRegistry)

{
  LCC_EVENT_TYPE_conflict event;
  FUNCTION_RETURN FVar1;
  int *piVar2;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar3;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar4;
  string temptativeLicense;
  string module_name;
  ifstream f;
  int aiStack_600 [122];
  char fname [1024];
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  memset(fname,0,0x400);
  FVar1 = getModuleName(fname);
  if (FVar1 == FUNC_RET_OK) {
    std::__cxx11::string::string((string *)&f,fname,(allocator *)&temptativeLicense);
    remove_extension(&module_name,(string *)&f);
    std::__cxx11::string::~string((string *)&f);
    std::__cxx11::string::string((string *)&f,(string *)&module_name);
    std::operator+(&temptativeLicense,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,".lic");
    std::__cxx11::string::~string((string *)&f);
    std::ifstream::ifstream(&f,temptativeLicense._M_dataplus._M_p,_S_in);
    if (*(int *)((long)aiStack_600 + *(long *)(_f + -0x18)) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,&temptativeLicense);
      event = LICENSE_FOUND;
    }
    else {
      event = IFF_UP;
    }
    EventRegistry::addEvent(eventRegistry,event,temptativeLicense._M_dataplus._M_p,(char *)0x0);
    std::ifstream::close();
    std::ifstream::~ifstream(&f);
    std::__cxx11::string::~string((string *)&temptativeLicense);
    std::__cxx11::string::~string((string *)&module_name);
  }
  else {
    piVar2 = __errno_location();
    uVar3 = extraout_XMM0_Da;
    uVar4 = extraout_XMM0_Db;
    if (*piVar2 != 0) {
      strerror(*piVar2);
      uVar3 = extraout_XMM0_Da_00;
      uVar4 = extraout_XMM0_Db_00;
    }
    _log((double)CONCAT44(uVar4,uVar3));
  }
  return __return_storage_ptr__;
}

Assistant:

const vector<string> ApplicationFolder::license_locations(EventRegistry &eventRegistry) {
	vector<string> diskFiles;
	char fname[MAX_PATH] = {0};
	const FUNCTION_RETURN fret = getModuleName(fname);
	if (fret == FUNC_RET_OK) {
		const string module_name = remove_extension(fname);
		const string temptativeLicense = string(module_name) + LCC_LICENSE_FILE_EXTENSION;
		ifstream f(temptativeLicense.c_str());
		if (f.good()) {
			diskFiles.push_back(temptativeLicense);
			eventRegistry.addEvent(LICENSE_FOUND, temptativeLicense.c_str());
		} else {
			eventRegistry.addEvent(LICENSE_FILE_NOT_FOUND, temptativeLicense.c_str());
		}
		f.close();
	} else {
		LOG_WARN("Error determining module name.");
	}
	return diskFiles;
}